

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBuffers.cpp
# Opt level: O0

void __thiscall
aeron::LogBuffers::LogBuffers
          (LogBuffers *this,uint8_t *address,int64_t logLength,int32_t termLength)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int i;
  AtomicBuffer *local_38;
  int local_30;
  
  *in_RDI = &PTR__LogBuffers_0022da70;
  std::shared_ptr<aeron::util::MemoryMappedFile>::shared_ptr
            ((shared_ptr<aeron::util::MemoryMappedFile> *)0x1ec526);
  local_38 = (AtomicBuffer *)(in_RDI + 3);
  do {
    concurrent::AtomicBuffer::AtomicBuffer(local_38);
    local_38 = local_38 + 1;
  } while (local_38 != (AtomicBuffer *)(in_RDI + 0xf));
  concurrent::AtomicBuffer::wrap
            ((AtomicBuffer *)(in_RDI + 0xc),(uint8_t *)(in_RDX + -0x1000 + in_RSI),0x1000);
  for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
    concurrent::AtomicBuffer::wrap
              ((AtomicBuffer *)(in_RDI + (long)local_30 * 3 + 3),
               (uint8_t *)(in_RSI + local_30 * in_ECX),(long)in_ECX);
  }
  return;
}

Assistant:

LogBuffers::LogBuffers(std::uint8_t *address, std::int64_t logLength, std::int32_t termLength)
{
    m_buffers[LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX]
        .wrap(address + (logLength - LogBufferDescriptor::LOG_META_DATA_LENGTH),
            LogBufferDescriptor::LOG_META_DATA_LENGTH);

    for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
    {
        m_buffers[i].wrap(address + (i * termLength), termLength);
    }
}